

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::OneofDescriptor_*,_google::protobuf::compiler::java::OneofGeneratorInfo>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::OneofDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::OneofDescriptor_*const,_google::protobuf::compiler::java::OneofGeneratorInfo>_>_>
::iterator::operator*(iterator *this)

{
  code *pcVar1;
  ctrl_t *__s;
  reference extraout_RAX;
  reference ppVar2;
  char *extraout_RDX;
  size_type in_RSI;
  
  pcVar1 = (code *)this->ctrl_;
  if (pcVar1 == (code *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
    ::iterator::operator*((iterator *)this);
  }
  else if (pcVar1 != google::protobuf::internal::TypeCardToString_abi_cxx11_) {
    if (-1 < (char)*pcVar1) {
      return (reference)(this->field_1).slot_;
    }
    goto LAB_0024b926;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
  ::iterator::operator*((iterator *)this);
LAB_0024b926:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::OneofDescriptor_const*,google::protobuf::compiler::java::OneofGeneratorInfo>,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::OneofDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::OneofDescriptor_const*const,google::protobuf::compiler::java::OneofGeneratorInfo>>>
  ::iterator::operator*((iterator *)this);
  this->ctrl_ = (ctrl_t *)0x0;
  *(undefined4 *)&this->field_1 = 0;
  this[1].ctrl_ = (ctrl_t *)0x0;
  *(undefined4 *)&this[1].field_1 = 0;
  this[2].ctrl_ = (ctrl_t *)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_initialize
            ((vector<bool,_std::allocator<bool>_> *)this,in_RSI);
  __s = this->ctrl_;
  if (__s != (ctrl_t *)0x0) {
    ppVar2 = (reference)memset(__s,(uint)(byte)-*extraout_RDX,(long)this[2].ctrl_ - (long)__s);
    return ppVar2;
  }
  return extraout_RAX;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }